

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

void ELFIO::dump::dynamic_tags(ostream *out,elfio *reader)

{
  elfio *peVar1;
  elf_header *peVar2;
  Elf_Xword EVar3;
  Elf_Xword value_00;
  int iVar4;
  uint uVar5;
  Elf_Xword EVar6;
  ostream *poVar7;
  pointer puVar8;
  Elf_Xword i;
  Elf_Xword index;
  pointer puVar9;
  Elf_Xword tag;
  Elf_Xword value;
  string str;
  dynamic_section_accessor dynamic;
  Elf_Xword local_90;
  elfio *local_88;
  Elf_Xword local_80;
  pointer local_78;
  pointer local_70;
  string local_68;
  dynamic_section_accessor_template<ELFIO::section> local_48;
  
  peVar1 = (reader->sections).parent;
  puVar9 = (peVar1->sections_).
           super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (peVar1->sections_).
           super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = reader;
  local_78 = puVar8;
  do {
    if (puVar9 == puVar8) {
      return;
    }
    iVar4 = (*((puVar9->_M_t).
               super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
               super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
               super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[5])();
    if (iVar4 == 6) {
      local_48.dynamic_section =
           (puVar9->_M_t).
           super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
           super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl;
      local_48.elf_file = local_88;
      local_48.entries_num = 0;
      EVar6 = dynamic_section_accessor_template<ELFIO::section>::get_entries_num(&local_48);
      if (EVar6 != 0) {
        poVar7 = std::operator<<(out,"Dynamic section (");
        local_70 = puVar9;
        (*((puVar9->_M_t).
           super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
           super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[3])
                  (&local_68);
        poVar7 = std::operator<<(poVar7,(string *)&local_68);
        poVar7 = std::operator<<(poVar7,")");
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&local_68);
        poVar7 = std::operator<<(out,"[  Nr ] Tag              Name/Value");
        std::endl<char,std::char_traits<char>>(poVar7);
        index = 0;
        do {
          if (EVar6 == index) break;
          local_90 = 0;
          local_80 = 0;
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          local_68._M_string_length = 0;
          local_68.field_2._M_local_buf[0] = '\0';
          dynamic_section_accessor_template<ELFIO::section>::get_entry
                    (&local_48,index,&local_90,&local_80,&local_68);
          value_00 = local_80;
          EVar3 = local_90;
          peVar2 = (local_88->header)._M_t.
                   super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                   .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
          if (peVar2 == (elf_header *)0x0) {
            uVar5 = 0;
          }
          else {
            uVar5 = (*peVar2->_vptr_elf_header[4])();
          }
          dynamic_tag(out,index,EVar3,value_00,&local_68,uVar5 & 0xff);
          EVar3 = local_90;
          std::__cxx11::string::~string((string *)&local_68);
          index = index + 1;
        } while (EVar3 != 0);
        std::endl<char,std::char_traits<char>>(out);
        puVar8 = local_78;
        puVar9 = local_70;
      }
    }
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

static void dynamic_tags( std::ostream& out, const elfio& reader )
    {
        for ( const auto& sec : reader.sections ) { // For all sections
            if ( SHT_DYNAMIC == sec->get_type() ) {
                dynamic_section_accessor dynamic( reader, sec.get() );

                Elf_Xword dyn_no = dynamic.get_entries_num();
                if ( dyn_no == 0 )
                    continue;

                out << "Dynamic section (" << sec->get_name() << ")"
                    << std::endl;
                out << "[  Nr ] Tag              Name/Value" << std::endl;
                for ( Elf_Xword i = 0; i < dyn_no; ++i ) {
                    Elf_Xword   tag   = 0;
                    Elf_Xword   value = 0;
                    std::string str;
                    dynamic.get_entry( i, tag, value, str );
                    dynamic_tag( out, i, tag, value, str, reader.get_class() );
                    if ( DT_NULL == tag ) {
                        break;
                    }
                }

                out << std::endl;
            }
        }
    }